

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O2

void testTiledRgba(string *tempDir)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  _Alloc_hider _Var4;
  Rgba RVar5;
  byte bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ostream *poVar13;
  undefined4 *puVar14;
  void *pvVar15;
  int *piVar16;
  char *pcVar17;
  long lVar18;
  int y_1;
  half *phVar19;
  int x;
  long lVar20;
  int y;
  ulong uVar21;
  long lVar22;
  half *phVar23;
  ulong uVar24;
  int i;
  long lVar25;
  ulong uVar26;
  int comp;
  Compression comp_00;
  long lVar27;
  int tileX;
  uint uVar28;
  ulong uVar29;
  half local_14a;
  string fileName;
  Header header;
  TiledRgbaOutputFile out;
  half hStack_ce;
  half hStack_cc;
  half hStack_ca;
  Array2D<Imf_3_4::Rgba> p1;
  half local_7a;
  Array2D<Imath_3_2::half> p2_2;
  Array2D<Imath_3_2::half> p1_1;
  long local_48;
  
  poVar13 = std::operator<<((ostream *)&std::cout,"Testing the tiled RGBA image interface");
  std::endl<char,std::char_traits<char>>(poVar13);
  bVar6 = IlmThread_3_4::supportsThreads();
  iVar12 = 0;
  while( true ) {
    if (iVar12 == (uint)bVar6 + (uint)bVar6 * 2 + 1) {
      poVar13 = std::operator<<((ostream *)&std::cout,"\nreading multi-layer file");
      std::endl<char,std::char_traits<char>>(poVar13);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                     tempDir,"imf_test_tiled_multi_layer_rgba.exr");
      p1_1._sizeX = 0x77;
      p1_1._sizeY = 0xed;
      p1_1._data = (half *)operator_new__(0xdc56);
      p2_2._sizeX = 0x77;
      p2_2._sizeY = 0xed;
      p2_2._data = (half *)operator_new__(0xdc56);
      local_48 = 0;
      uVar21 = 0;
      while( true ) {
        uVar29 = (uVar21 & 0xffffffff) % 0x1d;
        uVar24 = (uVar21 & 0xffffffff) % 0x17;
        if (uVar21 == 0x77) break;
        uVar26 = 0;
        lVar25 = 0;
        while( true ) {
          if (lVar25 == 0x1da) break;
          Imath_3_2::half::half((half *)&header,(float)((int)uVar24 + (int)(uVar26 / 0x11) * -0x11))
          ;
          *(uint16_t *)((long)&(p1_1._data)->_h + lVar25 + p1_1._sizeY * local_48) = _header;
          Imath_3_2::half::half((half *)&header,(float)((int)uVar29 + (int)(uVar26 / 0x13) * -0x13))
          ;
          *(uint16_t *)((long)&(p2_2._data)->_h + lVar25 + p2_2._sizeY * local_48) = _header;
          lVar25 = lVar25 + 2;
          uVar29 = (ulong)((int)uVar29 + 1);
          uVar26 = (ulong)((int)uVar26 + 1);
          uVar24 = (ulong)((int)uVar24 + 1);
        }
        uVar21 = uVar21 + 1;
        local_48 = local_48 + 2;
      }
      fileName._M_dataplus._M_p = (pointer)0x0;
      Imf_3_4::Header::Header
                (&header,0xed,0x77,1.0,(Vec2 *)&fileName,1.0,INCREASING_Y,ZIP_COMPRESSION);
      fileName._M_dataplus._M_p = (pointer)0x2000000020;
      fileName._M_string_length = 0;
      Imf_3_4::Header::setTileDescription((TileDescription *)&header);
      pcVar17 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar17,(Channel *)0x1997db);
      pcVar17 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar17,(Channel *)"foo.R");
      p1._sizeY = p1._sizeY & 0xffffffff00000000;
      p1._data = (Rgba *)0x0;
      Imf_3_4::Slice::Slice((Slice *)&fileName,HALF,(char *)p1_1._data,2,0x1da,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&p1,(Slice *)0x1997db);
      Imf_3_4::Slice::Slice((Slice *)&fileName,HALF,(char *)p2_2._data,2,0x1da,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert((char *)&p1,(Slice *)"foo.R");
      RVar5 = _out;
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledOutputFile::TiledOutputFile
                ((TiledOutputFile *)&fileName,(char *)RVar5,&header,iVar12);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&fileName);
      iVar12 = Imf_3_4::TiledOutputFile::numXTiles((int)&fileName);
      iVar8 = Imf_3_4::TiledOutputFile::numYTiles((int)&fileName);
      Imf_3_4::TiledOutputFile::writeTiles((int)&fileName,0,iVar12 + -1,0,iVar8 + -1);
      Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fileName);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&p1);
      Imf_3_4::Header::~Header(&header);
      RVar5 = _out;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileName,"",(allocator<char> *)&p1);
      iVar12 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,(char *)RVar5,(string *)&fileName,iVar12);
      std::__cxx11::string::~string((string *)&fileName);
      fileName._M_dataplus._M_p = (pointer)0x77;
      fileName._M_string_length = 0xed;
      fileName.field_2._M_allocated_capacity = (size_type)operator_new__(0x37158);
      Imf_3_4::TiledRgbaInputFile::setFrameBuffer
                ((Rgba *)&header,fileName.field_2._M_allocated_capacity,1);
      iVar12 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
      iVar8 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
      Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar12 + -1,0,iVar8 + -1);
      lVar25 = fileName.field_2._M_allocated_capacity + 6;
      lVar22 = 0;
      phVar23 = p1_1._data;
      do {
        if (lVar22 == 0x77) {
          Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&fileName);
          Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
          RVar5 = _out;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fileName,"foo",(allocator<char> *)&p1);
          iVar12 = Imf_3_4::globalThreadCount();
          Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                    ((TiledRgbaInputFile *)&header,(char *)RVar5,(string *)&fileName,iVar12);
          std::__cxx11::string::~string((string *)&fileName);
          fileName._M_dataplus._M_p = (pointer)0x77;
          fileName._M_string_length = 0xed;
          fileName.field_2._M_allocated_capacity = (size_type)operator_new__(0x37158);
          Imf_3_4::TiledRgbaInputFile::setFrameBuffer
                    ((Rgba *)&header,fileName.field_2._M_allocated_capacity,1);
          iVar12 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
          iVar8 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
          Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar12 + -1,0,iVar8 + -1);
          lVar25 = fileName.field_2._M_allocated_capacity + 6;
          lVar22 = 0;
          phVar23 = p2_2._data;
          do {
            if (lVar22 == 0x77) {
              Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&fileName);
              Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
              RVar5 = _out;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fileName,"",(allocator<char> *)&p1);
              iVar12 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                        ((TiledRgbaInputFile *)&header,(char *)RVar5,(string *)&fileName,iVar12);
              std::__cxx11::string::~string((string *)&fileName);
              p1._sizeX = 0x77;
              p1._sizeY = 0xed;
              p1._data = (Rgba *)operator_new__(0x37158);
              Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)p1._data,1);
              iVar12 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
              iVar8 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
              Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar12 + -1,0,iVar8 / 2 + -1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fileName,"foo",(allocator<char> *)&local_14a);
              Imf_3_4::TiledRgbaInputFile::setLayerName((string *)&header);
              std::__cxx11::string::~string((string *)&fileName);
              Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)p1._data,1);
              iVar12 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
              iVar8 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
              iVar9 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
              Imf_3_4::TiledRgbaInputFile::readTiles
                        ((int)&header,0,iVar12 + -1,iVar8 / 2,iVar9 + -1);
              lVar20 = 0;
              lVar25 = 0;
              lVar22 = 0;
              do {
                if (lVar22 == 0x77) {
                  Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&p1);
                  Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
                  fileName._M_dataplus._M_p = (pointer)0x0;
                  Imf_3_4::Header::Header
                            (&header,0xed,0x77,1.0,(Vec2 *)&fileName,1.0,INCREASING_Y,
                             ZIP_COMPRESSION);
                  fileName._M_dataplus._M_p = (pointer)0x2000000020;
                  fileName._M_string_length = 0;
                  Imf_3_4::Header::setTileDescription((TileDescription *)&header);
                  pcVar17 = (char *)Imf_3_4::Header::channels();
                  Imf_3_4::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
                  Imf_3_4::ChannelList::insert(pcVar17,(Channel *)0x1a4db5);
                  pcVar17 = (char *)Imf_3_4::Header::channels();
                  Imf_3_4::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
                  Imf_3_4::ChannelList::insert(pcVar17,(Channel *)"foo.Y");
                  p1._sizeY = p1._sizeY & 0xffffffff00000000;
                  p1._data = (Rgba *)0x0;
                  Imf_3_4::Slice::Slice
                            ((Slice *)&fileName,HALF,(char *)p1_1._data,2,0x1da,1,1,0.0,false,false)
                  ;
                  Imf_3_4::FrameBuffer::insert((char *)&p1,(Slice *)0x1a4db5);
                  Imf_3_4::Slice::Slice
                            ((Slice *)&fileName,HALF,(char *)p2_2._data,2,0x1da,1,1,0.0,false,false)
                  ;
                  Imf_3_4::FrameBuffer::insert((char *)&p1,(Slice *)"foo.Y");
                  RVar5 = _out;
                  iVar12 = Imf_3_4::globalThreadCount();
                  Imf_3_4::TiledOutputFile::TiledOutputFile
                            ((TiledOutputFile *)&fileName,(char *)RVar5,&header,iVar12);
                  Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&fileName);
                  iVar12 = Imf_3_4::TiledOutputFile::numXTiles((int)&fileName);
                  iVar8 = Imf_3_4::TiledOutputFile::numYTiles((int)&fileName);
                  Imf_3_4::TiledOutputFile::writeTiles((int)&fileName,0,iVar12 + -1,0,iVar8 + -1);
                  Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fileName);
                  std::
                  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                               *)&p1);
                  Imf_3_4::Header::~Header(&header);
                  RVar5 = _out;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&fileName,"",(allocator<char> *)&p1);
                  iVar12 = Imf_3_4::globalThreadCount();
                  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                            ((TiledRgbaInputFile *)&header,(char *)RVar5,(string *)&fileName,iVar12)
                  ;
                  std::__cxx11::string::~string((string *)&fileName);
                  fileName._M_dataplus._M_p = (pointer)0x77;
                  fileName._M_string_length = 0xed;
                  fileName.field_2._M_allocated_capacity = (size_type)operator_new__(0x37158);
                  Imf_3_4::TiledRgbaInputFile::setFrameBuffer
                            ((Rgba *)&header,fileName.field_2._M_allocated_capacity,1);
                  iVar12 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
                  iVar8 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
                  Imf_3_4::TiledRgbaInputFile::readTiles((int)&header,0,iVar12 + -1,0,iVar8 + -1);
                  lVar25 = fileName.field_2._M_allocated_capacity + 6;
                  lVar22 = 0;
                  phVar23 = p1_1._data;
                  do {
                    if (lVar22 == 0x77) {
                      Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&fileName)
                      ;
                      Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile
                                ((TiledRgbaInputFile *)&header);
                      RVar5 = _out;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&fileName,"foo",(allocator<char> *)&p1);
                      iVar12 = Imf_3_4::globalThreadCount();
                      Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                                ((TiledRgbaInputFile *)&header,(char *)RVar5,(string *)&fileName,
                                 iVar12);
                      std::__cxx11::string::~string((string *)&fileName);
                      fileName._M_dataplus._M_p = (pointer)0x77;
                      fileName._M_string_length = 0xed;
                      fileName.field_2._M_allocated_capacity = (size_type)operator_new__(0x37158);
                      Imf_3_4::TiledRgbaInputFile::setFrameBuffer
                                ((Rgba *)&header,fileName.field_2._M_allocated_capacity,1);
                      iVar12 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
                      iVar8 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
                      Imf_3_4::TiledRgbaInputFile::readTiles
                                ((int)&header,0,iVar12 + -1,0,iVar8 + -1);
                      lVar25 = fileName.field_2._M_allocated_capacity + 6;
                      lVar22 = 0;
                      phVar23 = p2_2._data;
                      do {
                        if (lVar22 == 0x77) {
                          Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
                                    ((Array2D<Imf_3_4::Rgba> *)&fileName);
                          Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile
                                    ((TiledRgbaInputFile *)&header);
                          RVar5 = _out;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&fileName,"",(allocator<char> *)&p1);
                          iVar12 = Imf_3_4::globalThreadCount();
                          Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
                                    ((TiledRgbaInputFile *)&header,(char *)RVar5,(string *)&fileName
                                     ,iVar12);
                          std::__cxx11::string::~string((string *)&fileName);
                          p1._sizeX = 0x77;
                          p1._sizeY = 0xed;
                          p1._data = (Rgba *)operator_new__(0x37158);
                          Imf_3_4::TiledRgbaInputFile::setFrameBuffer
                                    ((Rgba *)&header,(ulong)p1._data,1);
                          iVar12 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
                          iVar8 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
                          Imf_3_4::TiledRgbaInputFile::readTiles
                                    ((int)&header,0,iVar12 + -1,0,iVar8 / 2 + -1);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&fileName,"foo",(allocator<char> *)&local_14a);
                          Imf_3_4::TiledRgbaInputFile::setLayerName((string *)&header);
                          std::__cxx11::string::~string((string *)&fileName);
                          Imf_3_4::TiledRgbaInputFile::setFrameBuffer
                                    ((Rgba *)&header,(ulong)p1._data,1);
                          iVar12 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)&header);
                          iVar8 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
                          iVar9 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
                          Imf_3_4::TiledRgbaInputFile::readTiles
                                    ((int)&header,0,iVar12 + -1,iVar8 / 2,iVar9 + -1);
                          lVar20 = 0;
                          lVar25 = 0;
                          lVar22 = 0;
                          do {
                            if (lVar22 == 0x77) {
                              Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&p1);
                              Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile
                                        ((TiledRgbaInputFile *)&header);
                              remove((char *)_out);
                              Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(&p2_2);
                              Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(&p1_1);
                              std::__cxx11::string::~string((string *)&out);
                              poVar13 = std::operator<<((ostream *)&std::cout,"ok\n");
                              std::endl<char,std::char_traits<char>>(poVar13);
                              return;
                            }
                            lVar27 = 1;
                            while (lVar27 != 0x1db) {
                              iVar12 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
                              iVar8 = Imf_3_4::TiledRgbaInputFile::tileYSize();
                              lVar18 = p1._sizeY * lVar20;
                              fVar2 = *(float *)(_imath_half_to_float_table +
                                                (ulong)*(ushort *)
                                                        ((long)p1._data + lVar27 * 4 + lVar18 + -4)
                                                * 4);
                              if (lVar22 < iVar8 * (iVar12 / 2)) {
                                fVar3 = *(float *)(_imath_half_to_float_table +
                                                  (ulong)*(ushort *)
                                                          ((long)p1_1._data +
                                                          lVar27 + -1 + p1_1._sizeY * lVar25) * 4);
                                if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                  __assert_fail("p3[y][x].r == p1[y][x]",
                                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                                ,0x35f,
                                                "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                               );
                                }
                                fVar2 = *(float *)(_imath_half_to_float_table +
                                                  (ulong)*(ushort *)
                                                          ((long)p1._data + lVar27 * 4 + lVar18 + -2
                                                          ) * 4);
                                if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                  __assert_fail("p3[y][x].g == p1[y][x]",
                                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                                ,0x360,
                                                "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                               );
                                }
                                fVar2 = *(float *)(_imath_half_to_float_table +
                                                  (ulong)*(uint16_t *)
                                                          ((long)&(&(p1._data)->r)[lVar27 * 2]._h +
                                                          lVar18) * 4);
                                if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                  __assert_fail("p3[y][x].b == p1[y][x]",
                                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                                ,0x361,
                                                "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                               );
                                }
                              }
                              else {
                                fVar3 = *(float *)(_imath_half_to_float_table +
                                                  (ulong)*(ushort *)
                                                          ((long)p2_2._data +
                                                          lVar27 + -1 + p2_2._sizeY * lVar25) * 4);
                                if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                  __assert_fail("p3[y][x].r == p2[y][x]",
                                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                                ,0x365,
                                                "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                               );
                                }
                                fVar2 = *(float *)(_imath_half_to_float_table +
                                                  (ulong)*(ushort *)
                                                          ((long)p1._data + lVar27 * 4 + lVar18 + -2
                                                          ) * 4);
                                if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                  __assert_fail("p3[y][x].g == p2[y][x]",
                                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                                ,0x366,
                                                "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                               );
                                }
                                fVar2 = *(float *)(_imath_half_to_float_table +
                                                  (ulong)*(uint16_t *)
                                                          ((long)&(&(p1._data)->r)[lVar27 * 2]._h +
                                                          lVar18) * 4);
                                if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                                  __assert_fail("p3[y][x].b == p2[y][x]",
                                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                                ,0x367,
                                                "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                               );
                                }
                              }
                              fVar2 = *(float *)(_imath_half_to_float_table +
                                                (ulong)*(uint16_t *)
                                                        ((long)&(&(p1._data)->g)[lVar27 * 2]._h +
                                                        lVar18) * 4);
                              lVar27 = lVar27 + 2;
                              if ((fVar2 != 1.0) || (NAN(fVar2))) {
                                __assert_fail("p3[y][x].a == 1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                              ,0x36a,
                                              "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                             );
                              }
                            }
                            lVar22 = lVar22 + 1;
                            lVar25 = lVar25 + 2;
                            lVar20 = lVar20 + 8;
                          } while( true );
                        }
                        lVar20 = 0;
                        while (lVar20 != 0xed) {
                          fVar2 = *(float *)(_imath_half_to_float_table +
                                            (ulong)*(ushort *)(lVar25 + -6 + lVar20 * 8) * 4);
                          fVar3 = *(float *)(_imath_half_to_float_table +
                                            (ulong)phVar23[lVar20]._h * 4);
                          if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                            __assert_fail("p3[y][x].r == p2[y][x]",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x340,
                                          "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                         );
                          }
                          fVar2 = *(float *)(_imath_half_to_float_table +
                                            (ulong)*(ushort *)(lVar25 + -4 + lVar20 * 8) * 4);
                          if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                            __assert_fail("p3[y][x].g == p2[y][x]",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x341,
                                          "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                         );
                          }
                          fVar2 = *(float *)(_imath_half_to_float_table +
                                            (ulong)*(ushort *)(lVar25 + -2 + lVar20 * 8) * 4);
                          if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                            __assert_fail("p3[y][x].b == p2[y][x]",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x342,
                                          "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                         );
                          }
                          fVar2 = *(float *)(_imath_half_to_float_table +
                                            (ulong)*(ushort *)(lVar25 + lVar20 * 8) * 4);
                          lVar20 = lVar20 + 1;
                          if ((fVar2 != 1.0) || (NAN(fVar2))) {
                            __assert_fail("p3[y][x].a == 1",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                          ,0x343,
                                          "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                         );
                          }
                        }
                        lVar22 = lVar22 + 1;
                        lVar25 = lVar25 + fileName._M_string_length * 8;
                        phVar23 = phVar23 + p2_2._sizeY;
                      } while( true );
                    }
                    lVar20 = 0;
                    while (lVar20 != 0xed) {
                      fVar2 = *(float *)(_imath_half_to_float_table +
                                        (ulong)*(ushort *)(lVar25 + -6 + lVar20 * 8) * 4);
                      fVar3 = *(float *)(_imath_half_to_float_table + (ulong)phVar23[lVar20]._h * 4)
                      ;
                      if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                        __assert_fail("p3[y][x].r == p1[y][x]",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                      ,0x32d,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                      fVar2 = *(float *)(_imath_half_to_float_table +
                                        (ulong)*(ushort *)(lVar25 + -4 + lVar20 * 8) * 4);
                      if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                        __assert_fail("p3[y][x].g == p1[y][x]",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                      ,0x32e,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                      fVar2 = *(float *)(_imath_half_to_float_table +
                                        (ulong)*(ushort *)(lVar25 + -2 + lVar20 * 8) * 4);
                      if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                        __assert_fail("p3[y][x].b == p1[y][x]",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                      ,0x32f,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                      fVar2 = *(float *)(_imath_half_to_float_table +
                                        (ulong)*(ushort *)(lVar25 + lVar20 * 8) * 4);
                      lVar20 = lVar20 + 1;
                      if ((fVar2 != 1.0) || (NAN(fVar2))) {
                        __assert_fail("p3[y][x].a == 1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                      ,0x330,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                     );
                      }
                    }
                    lVar22 = lVar22 + 1;
                    lVar25 = lVar25 + fileName._M_string_length * 8;
                    phVar23 = phVar23 + p1_1._sizeY;
                  } while( true );
                }
                lVar27 = 0;
                while (lVar27 != 0xed) {
                  iVar12 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)&header);
                  iVar8 = Imf_3_4::TiledRgbaInputFile::tileYSize();
                  lVar18 = p1._sizeY * lVar20;
                  fVar2 = *(float *)(_imath_half_to_float_table +
                                    (ulong)*(uint16_t *)((long)&p1._data[lVar27].r._h + lVar18) * 4)
                  ;
                  if (lVar22 < iVar8 * (iVar12 / 2)) {
                    pfVar1 = (float *)(_imath_half_to_float_table +
                                      (ulong)*(uint16_t *)
                                              ((long)&p1_1._data[lVar27]._h + p1_1._sizeY * lVar25)
                                      * 4);
                    if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                      __assert_fail("p3[y][x].r == p1[y][x]",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x2fa,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                   );
                    }
                  }
                  else {
                    pfVar1 = (float *)(_imath_half_to_float_table +
                                      (ulong)*(uint16_t *)
                                              ((long)&p2_2._data[lVar27]._h + p2_2._sizeY * lVar25)
                                      * 4);
                    if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                      __assert_fail("p3[y][x].r == p2[y][x]",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                    ,0x2fc,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                   );
                    }
                  }
                  fVar2 = *(float *)(_imath_half_to_float_table +
                                    (ulong)*(uint16_t *)((long)&p1._data[lVar27].g._h + lVar18) * 4)
                  ;
                  if ((fVar2 != 0.0) || (NAN(fVar2))) {
                    __assert_fail("p3[y][x].g == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x2fe,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                  fVar2 = *(float *)(_imath_half_to_float_table +
                                    (ulong)*(uint16_t *)((long)&p1._data[lVar27].b._h + lVar18) * 4)
                  ;
                  if ((fVar2 != 0.0) || (NAN(fVar2))) {
                    __assert_fail("p3[y][x].b == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x2ff,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                  fVar2 = *(float *)(_imath_half_to_float_table +
                                    (ulong)*(uint16_t *)((long)&p1._data[lVar27].a._h + lVar18) * 4)
                  ;
                  lVar27 = lVar27 + 1;
                  if ((fVar2 != 1.0) || (NAN(fVar2))) {
                    __assert_fail("p3[y][x].a == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                                  ,0x300,
                                  "void (anonymous namespace)::writeReadLayers(const std::string &)"
                                 );
                  }
                }
                lVar22 = lVar22 + 1;
                lVar25 = lVar25 + 2;
                lVar20 = lVar20 + 8;
              } while( true );
            }
            lVar20 = 0;
            while (lVar20 != 0xed) {
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -6 + lVar20 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar20]._h * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p3[y][x].r == p2[y][x]",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x2dc,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -4 + lVar20 * 8) * 4);
              if ((fVar2 != 0.0) || (NAN(fVar2))) {
                __assert_fail("p3[y][x].g == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x2dd,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -2 + lVar20 * 8) * 4);
              if ((fVar2 != 0.0) || (NAN(fVar2))) {
                __assert_fail("p3[y][x].b == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x2de,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + lVar20 * 8) * 4);
              lVar20 = lVar20 + 1;
              if ((fVar2 != 1.0) || (NAN(fVar2))) {
                __assert_fail("p3[y][x].a == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                              ,0x2df,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
            }
            lVar22 = lVar22 + 1;
            lVar25 = lVar25 + fileName._M_string_length * 8;
            phVar23 = phVar23 + p2_2._sizeY;
          } while( true );
        }
        lVar20 = 0;
        while (lVar20 != 0xed) {
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar25 + -6 + lVar20 * 8) * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar23[lVar20]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p3[y][x].r == p1[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2c9,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar25 + -4 + lVar20 * 8) * 4);
          if ((fVar2 != 0.0) || (NAN(fVar2))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2ca,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar25 + -2 + lVar20 * 8) * 4);
          if ((fVar2 != 0.0) || (NAN(fVar2))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2cb,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar25 + lVar20 * 8) * 4);
          lVar20 = lVar20 + 1;
          if ((fVar2 != 1.0) || (NAN(fVar2))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x2cc,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
        }
        lVar22 = lVar22 + 1;
        lVar25 = lVar25 + fileName._M_string_length * 8;
        phVar23 = phVar23 + p1_1._sizeY;
      } while( true );
    }
    cVar7 = IlmThread_3_4::supportsThreads();
    if (cVar7 != '\0') {
      Imf_3_4::setGlobalThreadCount(iVar12);
      poVar13 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      iVar8 = Imf_3_4::globalThreadCount();
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar8);
      std::endl<char,std::char_traits<char>>(poVar13);
    }
    for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
      poVar13 = std::operator<<((ostream *)&std::cout,"\nImage size = ");
      iVar8 = (&DAT_001a9060)[lVar25];
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar8);
      poVar13 = std::operator<<(poVar13," x ");
      iVar9 = (&DAT_001a9070)[lVar25];
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar9);
      std::endl<char,std::char_traits<char>>(poVar13);
      for (comp_00 = NO_COMPRESSION; (int)comp_00 < 10; comp_00 = comp_00 + RLE_COMPRESSION) {
        if (comp_00 == ZIP_COMPRESSION) {
          comp_00 = PIZ_COMPRESSION;
        }
        if (lVar25 == 0) {
          anon_unknown.dwarf_2c04c6::writeRead(tempDir,iVar8,iVar9,comp_00,1,1);
        }
        anon_unknown.dwarf_2c04c6::writeRead(tempDir,iVar8,iVar9,comp_00,0x23,0x1a);
        anon_unknown.dwarf_2c04c6::writeRead(tempDir,iVar8,iVar9,comp_00,0x4b,0x34);
        anon_unknown.dwarf_2c04c6::writeRead(tempDir,iVar8,iVar9,comp_00,0x108,0x81);
      }
    }
    poVar13 = std::operator<<((ostream *)&std::cout,"\nfile with missing and broken tiles");
    std::endl<char,std::char_traits<char>>(poVar13);
    std::operator+(&fileName,tempDir,"imf_test_tiled_incomplete.exr");
    p1._sizeX = 300;
    p1._sizeY = 400;
    p1._data = (Rgba *)operator_new__(960000);
    lVar25 = 0;
    for (uVar21 = 0; uVar21 != 300; uVar21 = uVar21 + 1) {
      uVar28 = 0;
      lVar22 = 0;
      while( true ) {
        if (lVar22 == 0xc80) break;
        Imath_3_2::half::half((half *)&p1_1,(float)(int)(short)((uVar28 & 0xffff) % 5));
        Imath_3_2::half::half((half *)&p2_2,(float)(int)(short)((uVar28 & 0xffff) % 0x11));
        Imath_3_2::half::half(&local_14a,(float)(int)((uVar21 & 0xffffffff) % 0x17));
        Imath_3_2::half::half(&local_7a,(float)(int)((uVar21 & 0xffffffff) % 0x1d));
        *(ulong *)((long)&((p1._data)->r)._h + lVar22 + p1._sizeY * lVar25) =
             CONCAT26(local_7a._h,
                      CONCAT24(local_14a._h,
                               CONCAT22((undefined2)p2_2._sizeX,(undefined2)p1_1._sizeX)));
        lVar22 = lVar22 + 8;
        uVar28 = uVar28 + 1;
      }
      lVar25 = lVar25 + 8;
    }
    poVar13 = std::operator<<((ostream *)&std::cout,"writing");
    std::endl<char,std::char_traits<char>>(poVar13);
    remove(fileName._M_dataplus._M_p);
    _out = 0;
    hStack_ce._h = 0;
    hStack_cc._h = 0;
    hStack_ca._h = 0;
    Imf_3_4::Header::Header(&header,400,300,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
    puVar14 = (undefined4 *)Imf_3_4::Header::lineOrder();
    _Var4 = fileName._M_dataplus;
    *puVar14 = 2;
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
              (&out,_Var4._M_p,&header,WRITE_RGBA,0x1e,0x28,ONE_LEVEL,ROUND_DOWN,iVar8);
    Imf_3_4::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1._data,1);
    Imf_3_4::TiledRgbaOutputFile::writeTile((int)(Rgba *)&out,0,0);
    for (iVar8 = 0; iVar9 = Imf_3_4::TiledRgbaOutputFile::numYTiles((int)&out), iVar8 < iVar9;
        iVar8 = iVar8 + 1) {
      for (iVar9 = 0; iVar10 = Imf_3_4::TiledRgbaOutputFile::numXTiles((int)&out), iVar9 < iVar10;
          iVar9 = iVar9 + 1) {
        if ((iVar8 + iVar9 & 1U) != 0) {
          Imf_3_4::TiledRgbaOutputFile::writeTile((int)&out,iVar9,iVar8);
        }
      }
    }
    iVar8 = (int)&out;
    Imf_3_4::TiledRgbaOutputFile::writeTile(iVar8,2,0);
    Imf_3_4::TiledRgbaOutputFile::breakTile(iVar8,0,0,0,0,0x19,'\n');
    Imf_3_4::TiledRgbaOutputFile::breakTile(iVar8,2,0,0,0,0x19,'\n');
    Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
    Imf_3_4::Header::~Header(&header);
    _out = 300;
    hStack_ce._h = 0;
    hStack_cc._h = 0;
    hStack_ca._h = 0;
    pvVar15 = operator_new__(960000);
    lVar25 = 0;
    for (lVar22 = 0; lVar22 != 300; lVar22 = lVar22 + 1) {
      for (lVar20 = 0; lVar20 != 400; lVar20 = lVar20 + 1) {
        *(undefined8 *)((long)pvVar15 + lVar20 * 8 + lVar25 * 400) = 0xbc00bc00bc00bc00;
      }
      lVar25 = lVar25 + 8;
    }
    std::operator<<((ostream *)&std::cout,"reading one tile at a time,");
    std::ostream::flush();
    _Var4 = fileName._M_dataplus;
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&header,_Var4._M_p,iVar8);
    piVar16 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
    if (piVar16[2] - *piVar16 != 399) {
      __assert_fail("dw.max.x - dw.min.x + 1 == width",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x217,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (piVar16[3] - piVar16[1] != 299) {
      __assert_fail("dw.max.y - dw.min.y + 1 == height",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x218,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (*piVar16 != 0) {
      __assert_fail("dw.min.x == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x219,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (piVar16[1] != 0) {
      __assert_fail("dw.min.y == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x21a,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar15,1);
    iVar8 = 0;
    while( true ) {
      iVar10 = (int)(Rgba *)&header;
      iVar9 = Imf_3_4::TiledRgbaInputFile::numYTiles(iVar10);
      if (iVar9 <= iVar8) break;
      for (iVar9 = 0; iVar11 = Imf_3_4::TiledRgbaInputFile::numXTiles(iVar10), iVar9 < iVar11;
          iVar9 = iVar9 + 1) {
        Imf_3_4::TiledRgbaInputFile::readTile(iVar10,iVar9,iVar8);
        if ((iVar8 + iVar9 & 1U) != 1) {
          __assert_fail("tileBroken || (tilePresent == ((tileX + tileY) & 1))",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                        ,0x232,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
      }
      iVar8 = iVar8 + 1;
    }
    poVar13 = std::operator<<((ostream *)&std::cout," comparing");
    std::endl<char,std::char_traits<char>>(poVar13);
    std::ostream::flush();
    lVar22 = (long)pvVar15 + 6;
    phVar19 = &(p1._data)->a;
    for (lVar25 = 0; lVar25 != 300; lVar25 = lVar25 + 1) {
      for (lVar20 = 0; lVar20 != 400; lVar20 = lVar20 + 1) {
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(lVar22 + -6 + lVar20 * 8) * 4);
        if (((ushort)lVar20 / 0x1e + (ushort)lVar25 / 0x28 & 1) == 0) {
          if ((((fVar2 != -1.0) || (NAN(fVar2))) ||
              (fVar2 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)(lVar22 + -4 + lVar20 * 8) * 4), fVar2 != -1.0))
             || (((NAN(fVar2) ||
                  (fVar2 = *(float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)(lVar22 + -2 + lVar20 * 8) * 4),
                  fVar2 != -1.0)) ||
                 ((NAN(fVar2) ||
                  ((fVar2 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)(lVar22 + lVar20 * 8) * 4), fVar2 != -1.0 ||
                   (NAN(fVar2))))))))) {
            __assert_fail("t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x24a,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
        }
        else {
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar19[lVar20 * 4 + -3]._h * 4);
          if (((((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) ||
               (fVar2 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar22 + -4 + lVar20 * 8) * 4),
               pfVar1 = (float *)(_imath_half_to_float_table +
                                 (ulong)phVar19[lVar20 * 4 + -2]._h * 4), fVar2 != *pfVar1)) ||
              ((NAN(fVar2) || NAN(*pfVar1) ||
               (fVar2 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar22 + -2 + lVar20 * 8) * 4),
               pfVar1 = (float *)(_imath_half_to_float_table +
                                 (ulong)phVar19[lVar20 * 4 + -1]._h * 4), fVar2 != *pfVar1)))) ||
             ((NAN(fVar2) || NAN(*pfVar1) ||
              ((fVar2 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar22 + lVar20 * 8) * 4),
               pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar19[lVar20 * 4]._h * 4),
               fVar2 != *pfVar1 || (NAN(fVar2) || NAN(*pfVar1))))))) {
            __assert_fail("t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x246,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
        }
      }
      lVar22 = lVar22 + 0xc80;
      phVar19 = phVar19 + p1._sizeY * 4;
    }
    Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&out);
    _out = 300;
    hStack_ce._h = 0;
    hStack_cc._h = 0;
    hStack_ca._h = 0;
    pvVar15 = operator_new__(960000);
    lVar25 = 0;
    for (lVar22 = 0; lVar22 != 300; lVar22 = lVar22 + 1) {
      for (lVar20 = 0; lVar20 != 400; lVar20 = lVar20 + 1) {
        *(undefined8 *)((long)pvVar15 + lVar20 * 8 + lVar25 * 400) = 0xbc00bc00bc00bc00;
      }
      lVar25 = lVar25 + 8;
    }
    std::operator<<((ostream *)&std::cout,"reading multiple tiles at a time,");
    std::ostream::flush();
    _Var4 = fileName._M_dataplus;
    iVar8 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&header,_Var4._M_p,iVar8);
    piVar16 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
    if (piVar16[2] - *piVar16 != 399) {
      __assert_fail("dw.max.x - dw.min.x + 1 == width",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x25c,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (piVar16[3] - piVar16[1] != 299) {
      __assert_fail("dw.max.y - dw.min.y + 1 == height",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x25d,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (*piVar16 != 0) {
      __assert_fail("dw.min.x == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x25e,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (piVar16[1] != 0) {
      __assert_fail("dw.min.y == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                    ,0x25f,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar15,1);
    iVar8 = Imf_3_4::TiledRgbaInputFile::numYTiles(iVar10);
    if (0 < iVar8) break;
    poVar13 = std::operator<<((ostream *)&std::cout," comparing");
    std::endl<char,std::char_traits<char>>(poVar13);
    std::ostream::flush();
    lVar25 = (long)pvVar15 + 6;
    phVar19 = &(p1._data)->a;
    for (lVar22 = 0; lVar22 != 300; lVar22 = lVar22 + 1) {
      for (lVar20 = 0; lVar20 != 400; lVar20 = lVar20 + 1) {
        fVar2 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(lVar25 + -6 + lVar20 * 8) * 4);
        if (((((fVar2 != -1.0) || (NAN(fVar2))) ||
             (fVar3 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -4 + lVar20 * 8) * 4), fVar3 != -1.0))
            || (((NAN(fVar3) ||
                 (fVar3 = *(float *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)(lVar25 + -2 + lVar20 * 8) * 4), fVar3 != -1.0
                 )) || ((NAN(fVar3) ||
                        ((fVar3 = *(float *)(_imath_half_to_float_table +
                                            (ulong)*(ushort *)(lVar25 + lVar20 * 8) * 4),
                         fVar3 != -1.0 || (NAN(fVar3))))))))) &&
           (((pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar19[lVar20 * 4 + -3]._h * 4
                                ), fVar2 != *pfVar1 ||
             ((((NAN(fVar2) || NAN(*pfVar1) ||
                (fVar2 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)(lVar25 + -4 + lVar20 * 8) * 4),
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)phVar19[lVar20 * 4 + -2]._h * 4), fVar2 != *pfVar1)) ||
               (NAN(fVar2) || NAN(*pfVar1))) ||
              ((fVar2 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(lVar25 + -2 + lVar20 * 8) * 4),
               pfVar1 = (float *)(_imath_half_to_float_table +
                                 (ulong)phVar19[lVar20 * 4 + -1]._h * 4), fVar2 != *pfVar1 ||
               (NAN(fVar2) || NAN(*pfVar1))))))) ||
            ((fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + lVar20 * 8) * 4),
             pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar19[lVar20 * 4]._h * 4),
             fVar2 != *pfVar1 || (NAN(fVar2) || NAN(*pfVar1))))))) {
          __assert_fail("(t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1) || (t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                        ,0x283,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
      }
      lVar25 = lVar25 + 0xc80;
      phVar19 = phVar19 + p1._sizeY * 4;
    }
    Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D((Array2D<Imf_3_4::Rgba> *)&out);
    remove(fileName._M_dataplus._M_p);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&p1);
    std::__cxx11::string::~string((string *)&fileName);
    iVar12 = iVar12 + 1;
  }
  iVar12 = Imf_3_4::TiledRgbaInputFile::numXTiles(iVar10);
  Imf_3_4::TiledRgbaInputFile::readTiles(iVar10,0,iVar12 + -1,0,0);
  __assert_fail("tilesMissing || tilesBroken",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                ,0x275,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
}

Assistant:

void
testTiledRgba (const std::string& tempDir)
{
    try
    {
        cout << "Testing the tiled RGBA image interface" << endl;

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            const int W[] = {9, 69, 75, 80};
            const int H[] = {7, 50, 52, 55};

            for (int i = 0; i < 4; ++i)
            {
                cout << "\nImage size = " << W[i] << " x " << H[i] << endl;

                for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
                {
                    //
                    // for tiled files, ZIPS and ZIP are the same thing
                    //

                    if (comp == ZIP_COMPRESSION) comp++;

                    if (i == 0)
                    {
                        //
                        // for single-pixel tiles, we don't gain anything
                        // by testing multiple image sizes (and singe-pixel
                        // tiles are rather slow anyway)
                        //

                        writeRead (
                            tempDir, W[i], H[i], Compression (comp), 1, 1);
                    }

                    writeRead (tempDir, W[i], H[i], Compression (comp), 35, 26);
                    writeRead (tempDir, W[i], H[i], Compression (comp), 75, 52);
                    writeRead (
                        tempDir, W[i], H[i], Compression (comp), 264, 129);
                }
            }

            writeReadIncomplete (tempDir);
        }

        writeReadLayers (tempDir);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}